

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void parse_socket_opts(int argc,char **argv,socket_config *config)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int opt;
  socket_config *config_local;
  char **argv_local;
  int argc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while (iVar2 = getopt(argc,argv,"+kpahwrb:"), iVar2 != -1) {
    switch(iVar2) {
    case 0x61:
      activate_aspa_update_cb = true;
      config->print_aspa_updates = true;
      break;
    case 0x62:
      config->bindaddr = _optarg;
      break;
    default:
      print_usage(argv);
      exit(1);
    case 0x6b:
      activate_spki_update_cb = true;
      config->print_spki_updates = true;
      break;
    case 0x70:
      activate_pfx_update_cb = true;
      config->print_pfx_updates = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_socket_opts(int argc, char **argv, struct socket_config *config)
{
	int opt;

	while ((opt = getopt(argc, argv, "+kpahwrb:")) != -1) {
		switch (opt) {
		case 'k':
			activate_spki_update_cb = true;
			config->print_spki_updates = true;
			break;

		case 'p':
			activate_pfx_update_cb = true;
			config->print_pfx_updates = true;
			break;

		case 'a':
			activate_aspa_update_cb = true;
			config->print_aspa_updates = true;
			break;

		case 'b':
			config->bindaddr = optarg;
			break;

#ifdef RTRLIB_HAVE_LIBSSH
		case 'w':
			if (config->force_key)
				print_error_exit("-w and -r are mutually exclusive");

			config->force_password = true;
			break;

		case 'r':
			if (config->force_password)
				print_error_exit("-w and -r are mutually exclusive");

			config->force_key = true;
			break;
#endif

		default:
			print_usage(argv);
			exit(EXIT_FAILURE);
		}
	}
}